

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O2

Aig_Man_t * Aig_ManDupTrim(Aig_Man_t *p)

{
  int iVar1;
  uint uVar2;
  Aig_Man_t *p_00;
  char *pcVar3;
  Aig_Obj_t *pObj;
  Aig_Obj_t *p1;
  Aig_Obj_t *pAVar4;
  int iVar5;
  
  p_00 = Aig_ManStart(p->vObjs->nSize);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar3;
  iVar5 = p->nBarBufs;
  p_00->nConstrs = p->nConstrs;
  p_00->nBarBufs = iVar5;
  Aig_ManCleanData(p);
  iVar5 = 0;
  do {
    if (p->vObjs->nSize <= iVar5) {
      if (p->nObjs[6] + p->nObjs[5] == p_00->nObjs[6] + p_00->nObjs[5]) {
        uVar2 = Aig_ManCleanup(p_00);
        if (uVar2 != 0) {
          printf("Aig_ManDupTrim(): Cleanup after AIG duplication removed %d nodes.\n",(ulong)uVar2)
          ;
        }
        Aig_ManSetRegNum(p_00,p->nRegs);
        iVar5 = Aig_ManCheck(p_00);
        if (iVar5 == 0) {
          puts("Aig_ManDupTrim(): The check has failed.");
        }
        return p_00;
      }
      __assert_fail("Aig_ManNodeNum(p) == Aig_ManNodeNum(pNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigDup.c"
                    ,0x1b9,"Aig_Man_t *Aig_ManDupTrim(Aig_Man_t *)");
    }
    pObj = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,iVar5);
    if (pObj != (Aig_Obj_t *)0x0) {
      uVar2 = (uint)*(undefined8 *)&pObj->field_0x18;
      if ((uVar2 & 7) - 7 < 0xfffffffe) {
        if ((uVar2 & 7) == 3) {
          pAVar4 = Aig_ObjChild0Copy(pObj);
          pAVar4 = Aig_ObjCreateCo(p_00,pAVar4);
        }
        else if ((uVar2 & 7) == 2) {
          if (uVar2 < 0x40) {
            iVar1 = Aig_ObjCioId(pObj);
            if (iVar1 < p->nTruePis) {
              pAVar4 = (Aig_Obj_t *)0x0;
              goto LAB_004f85d9;
            }
          }
          pAVar4 = Aig_ObjCreateCi(p_00);
        }
        else {
          iVar1 = Aig_ObjIsConst1(pObj);
          if (iVar1 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigDup.c"
                          ,0x1b6,"Aig_Man_t *Aig_ManDupTrim(Aig_Man_t *)");
          }
          pAVar4 = p_00->pConst1;
        }
      }
      else {
        pAVar4 = Aig_ObjChild0Copy(pObj);
        p1 = Aig_ObjChild1Copy(pObj);
        pAVar4 = Aig_Oper(p_00,pAVar4,p1,*(Aig_Type_t *)&pObj->field_0x18 & AIG_OBJ_VOID);
      }
LAB_004f85d9:
      (pObj->field_5).pData = pAVar4;
    }
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

Aig_Man_t * Aig_ManDupTrim( Aig_Man_t * p )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjNew;
    int i, nNodes;
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->nConstrs = p->nConstrs;
    pNew->nBarBufs = p->nBarBufs;
    // create the PIs
    Aig_ManCleanData( p );
    // duplicate internal nodes
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( Aig_ObjIsNode(pObj) )
            pObjNew = Aig_Oper( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj), Aig_ObjType(pObj) );
        else if ( Aig_ObjIsCi(pObj) )
            pObjNew = (Aig_ObjRefs(pObj) > 0 || Saig_ObjIsLo(p, pObj)) ? Aig_ObjCreateCi(pNew) : NULL;
        else if ( Aig_ObjIsCo(pObj) )
            pObjNew = Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
        else if ( Aig_ObjIsConst1(pObj) )
            pObjNew = Aig_ManConst1(pNew);
        else
            assert( 0 );
        pObj->pData = pObjNew;
    }
    assert( Aig_ManNodeNum(p) == Aig_ManNodeNum(pNew) );
    if ( (nNodes = Aig_ManCleanup( pNew )) )
        printf( "Aig_ManDupTrim(): Cleanup after AIG duplication removed %d nodes.\n", nNodes );
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    // check the resulting network
    if ( !Aig_ManCheck(pNew) )
        printf( "Aig_ManDupTrim(): The check has failed.\n" );
    return pNew;
}